

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall despot::Parser::Check(Parser *this)

{
  pointer pNVar1;
  bool bVar2;
  int iVar3;
  int action;
  ostream *poVar4;
  OBS_TYPE obs;
  int s;
  int iVar5;
  double dVar6;
  double rand;
  vector<int,_std::allocator<int>_> state;
  _Vector_base<int,_std::allocator<int>_> local_60;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  Print(this,(ostream *)&std::cout);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar4 = std::operator<<((ostream *)&std::cout,"# Terminal states:");
  std::endl<char,std::char_traits<char>>(poVar4);
  iVar5 = 0;
  while( true ) {
    iVar3 = NumStates(this);
    if (iVar3 <= iVar5) break;
    ComputeState((vector<int,_std::allocator<int>_> *)
                 &state.super__Vector_base<int,_std::allocator<int>_>,this,iVar5);
    bVar2 = IsTerminalState(this,(vector<int,_std::allocator<int>_> *)
                                 &state.super__Vector_base<int,_std::allocator<int>_>);
    if (bVar2) {
      PrintState(this,(vector<int,_std::allocator<int>_> *)
                      &state.super__Vector_base<int,_std::allocator<int>_>,(ostream *)&std::cout);
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&state.super__Vector_base<int,_std::allocator<int>_>);
    iVar5 = iVar5 + 1;
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  for (iVar5 = 0; iVar5 != 0x14; iVar5 = iVar5 + 1) {
    rand = Random::NextDouble((Random *)&Random::RANDOM);
    ComputeState(&state,this,rand);
    poVar4 = std::operator<<((ostream *)&std::cout,"s = ");
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&local_48,&state);
    poVar4 = despot::operator<<(poVar4,(vector<int,_std::allocator<int>_> *)&local_48);
    std::operator<<(poVar4," - ");
    poVar4 = std::ostream::_M_insert<double>(rand);
    std::endl<char,std::char_traits<char>>(poVar4);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
    PrintState(this,&state,(ostream *)&std::cout);
    iVar3 = 2;
    while (bVar2 = iVar3 != 0, iVar3 = iVar3 + -1, bVar2) {
      pNVar1 = (this->action_vars_).
               super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>._M_impl.
               super__Vector_impl_data._M_start;
      action = Random::NextInt((Random *)&Random::RANDOM,
                               (int)((ulong)((long)*(pointer *)
                                                    ((long)&(pNVar1->super_Variable).values_.
                                                                                                                        
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  + 8) -
                                            *(long *)&(pNVar1->super_Variable).values_.
                                                                                                            
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data) >> 5));
      poVar4 = std::operator<<((ostream *)&std::cout,"a = ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,action);
      std::endl<char,std::char_traits<char>>(poVar4);
      PrintAction(this,action,(ostream *)&std::cout);
      rand = Random::NextDouble((Random *)&Random::RANDOM);
      GetNextState(this,&state,action,&rand);
      poVar4 = std::operator<<((ostream *)&std::cout,"s\' = ");
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&local_60,&state);
      poVar4 = despot::operator<<(poVar4,(vector<int,_std::allocator<int>_> *)&local_60);
      std::operator<<(poVar4," - ");
      poVar4 = std::ostream::_M_insert<double>(rand);
      std::endl<char,std::char_traits<char>>(poVar4);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_60);
      PrintState(this,&state,(ostream *)&std::cout);
      std::operator<<((ostream *)&std::cout,"r = ");
      dVar6 = GetReward(this,action);
      poVar4 = std::ostream::_M_insert<double>(dVar6);
      std::endl<char,std::char_traits<char>>(poVar4);
      rand = Random::NextDouble((Random *)&Random::RANDOM);
      obs = GetObservation(this,&state,action,&rand);
      poVar4 = std::operator<<((ostream *)&std::cout,"o = ");
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::operator<<(poVar4," - ");
      poVar4 = std::ostream::_M_insert<double>(rand);
      std::operator<<(poVar4," ");
      dVar6 = ObsProb(this,obs,&state,action);
      poVar4 = std::ostream::_M_insert<double>(dVar6);
      std::endl<char,std::char_traits<char>>(poVar4);
      PrintObs(this,obs,(ostream *)&std::cout);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    }
    poVar4 = std::operator<<((ostream *)&std::cout,"----------------------------------");
    std::endl<char,std::char_traits<char>>(poVar4);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&state.super__Vector_base<int,_std::allocator<int>_>);
  }
  exit(0);
}

Assistant:

void Parser::Check() {
	cout << *this << endl;

	cout << "# Terminal states:" << endl;
	for (int s = 0; s < NumStates(); s++) {
		vector<int> state = ComputeState(s);
		if (IsTerminalState(state))
			PrintState(state);
	}
	cout << endl;

	double rand;
	ACT_TYPE action;
	OBS_TYPE obs;
	for (int i = 0; i < 20; i++) {
		rand = Random::RANDOM.NextDouble();
		vector<int> state = ComputeState(rand);
		cout << "s = " << state << " - " << rand << endl;
		PrintState(state);

		for (int j = 0; j < 2; j++) {
			action = Random::RANDOM.NextInt(action_vars_[0].Size());
			cout << "a = " << action << endl;
			PrintAction(action);
			rand = Random::RANDOM.NextDouble();
			GetNextState(state, action, rand);
			cout << "s' = " << state << " - " << rand << endl;
			PrintState(state);
			cout << "r = " << GetReward(action) << endl;
			rand = Random::RANDOM.NextDouble();
			obs = GetObservation(state, action, rand);
			cout << "o = " << obs << " - " << rand << " "
				<< ObsProb(obs, state, action) << endl;
			PrintObs(obs);
			cout << endl;
		}

		cout << "----------------------------------" << endl;
	}
	exit(0);
}